

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.hpp
# Opt level: O1

void __thiscall Matrix<int>::transpose(Matrix<int> *this)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  size_type sVar5;
  size_type sVar6;
  size_type sVar7;
  pointer piVar8;
  pointer piVar9;
  ulong uVar10;
  ulong uVar11;
  size_type sVar12;
  int *piVar13;
  long lVar14;
  size_type sVar15;
  pointer piVar16;
  Matrix<int> t;
  Matrix<int> local_58;
  
  uVar3 = *this->num_rows;
  uVar4 = *this->num_cols;
  if (uVar3 == uVar4) {
    if (uVar3 != 0) {
      piVar8 = (this->data_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar5 = this->cols_;
      piVar9 = piVar8 + sVar5;
      piVar8 = piVar8 + 1;
      uVar10 = 0;
      do {
        uVar11 = uVar10 + 1;
        if (uVar11 < uVar4) {
          lVar14 = 1;
          piVar16 = piVar9;
          do {
            iVar2 = piVar8[lVar14 + -1];
            piVar8[lVar14 + -1] = *piVar16;
            *piVar16 = iVar2;
            lVar1 = uVar10 + lVar14;
            lVar14 = lVar14 + 1;
            piVar16 = piVar16 + sVar5;
          } while (lVar1 + 1U < uVar4);
        }
        piVar8 = piVar8 + sVar5 + 1;
        piVar9 = piVar9 + sVar5 + 1;
        uVar10 = uVar11;
      } while (uVar11 != uVar3);
    }
  }
  else {
    Matrix(&local_58,*this->num_cols,*this->num_rows);
    sVar5 = *this->num_rows;
    if (sVar5 != 0) {
      sVar6 = *this->num_cols;
      piVar9 = (this->data_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar7 = this->cols_;
      sVar12 = 0;
      piVar8 = local_58.data_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        if (sVar6 != 0) {
          sVar15 = 0;
          piVar13 = piVar8;
          do {
            *piVar13 = piVar9[sVar15];
            sVar15 = sVar15 + 1;
            piVar13 = piVar13 + local_58.cols_;
          } while (sVar6 != sVar15);
        }
        sVar12 = sVar12 + 1;
        piVar9 = piVar9 + sVar7;
        piVar8 = piVar8 + 1;
      } while (sVar12 != sVar5);
    }
    piVar9 = (this->data_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar8 = (this->data_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    piVar16 = (this->data_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    (this->data_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = local_58.data_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    (this->data_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_58.data_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
    (this->data_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_58.data_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    if (piVar9 != (pointer)0x0) {
      local_58.data_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = piVar9;
      local_58.data_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = piVar8;
      local_58.data_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = piVar16;
      operator_delete(piVar9,(long)piVar16 - (long)piVar9);
    }
  }
  sVar5 = this->rows_;
  this->rows_ = this->cols_;
  this->cols_ = sVar5;
  return;
}

Assistant:

void transpose(){
    // if matrix is square, no extra memory is needed to build its transpose
    if (num_rows == num_cols){
      for (size_type i {0}; i < num_rows; i++){
        for (size_type j {i + 1}; j < num_cols; j++){
          std::swap(at(i, j), at(j, i));
        }
      }
    }
    // if matrix is not square, some extra memory is needed to build
    // its transpose
    else{
      // auxiliar memory to temporarily hold the transpose
      Matrix<Type> t {num_cols, num_rows};
      // builds transpose
      for (size_type i {0}; i < num_rows; i++){
        for (size_type j {0}; j < num_cols; j++){
          t.at(j, i) = at(i, j);
        }
      }
      // exchanges matrix data with t data, which is about to die
      std::swap(data_, t.data_);
    }
    // exchanges number of rows and columns
    std::swap(rows_, cols_);
  }